

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall chrono::ChAssembly::RemoveBody(ChAssembly *this,shared_ptr<chrono::ChBody> *body)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChBody>*,std::vector<std::shared_ptr<chrono::ChBody>,std::allocator<std::shared_ptr<chrono::ChBody>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::ChBody>const>>
                         ((this->bodylist).
                          super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->bodylist).
                          super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,body);
  if (__position._M_current !=
      (this->bodylist).
      super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
    ::_M_erase(&this->bodylist,(iterator)__position._M_current);
    peVar1 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[6])(peVar1,0);
    ((this->super_ChPhysicsItem).system)->is_updated = false;
    return;
  }
  __assert_fail("itr != bodylist.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xa2,"void chrono::ChAssembly::RemoveBody(std::shared_ptr<ChBody>)");
}

Assistant:

void ChAssembly::RemoveBody(std::shared_ptr<ChBody> body) {
    auto itr = std::find(std::begin(bodylist), std::end(bodylist), body);
    assert(itr != bodylist.end());

    bodylist.erase(itr);
    body->SetSystem(nullptr);

    system->is_updated = false;
}